

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterBuilder.cpp
# Opt level: O1

void __thiscall
slang::ast::ParameterBuilder::setAssignments
          (ParameterBuilder *this,ParameterValueAssignmentSyntax *syntax,bool isFromConfig)

{
  char_pointer puVar1;
  SyntaxKind SVar2;
  NamedParamAssignmentSyntax *this_00;
  Scope *pSVar3;
  size_t sVar4;
  long lVar5;
  size_t __n;
  group_type_pointer pgVar6;
  value_type_pointer ppVar7;
  uint uVar8;
  size_t *psVar9;
  value_type_pointer ppVar10;
  value_type_pointer ppVar11;
  int iVar12;
  ulong uVar13;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar14;
  SourceLocation SVar15;
  arrays_type *paVar16;
  Diagnostic *pDVar17;
  uint64_t uVar18;
  char_pointer puVar19;
  uint uVar20;
  undefined7 uVar22;
  arrays_type *paVar21;
  undefined7 in_register_00000011;
  arrays_type *paVar23;
  pointer pPVar24;
  char_pointer puVar25;
  arrays_type *paVar26;
  arrays_type *paVar27;
  pointer pPVar28;
  arrays_type *paVar29;
  char *pcVar30;
  char *pcVar31;
  arrays_type *paVar32;
  arrays_type *paVar33;
  arrays_type *paVar34;
  arrays_type *paVar35;
  ParameterValueAssignmentSyntax *pPVar36;
  pointer pPVar37;
  Token *this_01;
  long lVar38;
  undefined1 *puVar39;
  ParameterBuilder *pPVar40;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>
  *pair;
  table_element_pointer ppVar41;
  bool bVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  char cVar48;
  char cVar49;
  char cVar50;
  char cVar51;
  char cVar52;
  char cVar53;
  char cVar54;
  char cVar55;
  char cVar56;
  char cVar57;
  char cVar58;
  char cVar59;
  char cVar60;
  char cVar61;
  char cVar62;
  char cVar63;
  iterator iVar64;
  string_view arg;
  locator res;
  string_view name;
  value_type *elements;
  SmallVector<const_slang::syntax::OrderedParamAssignmentSyntax_*,_5UL> orderedParams;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
  namedParams;
  undefined1 local_2a9 [33];
  pointer local_288;
  arrays_type *local_280;
  arrays_type *local_278;
  arrays_type *local_270;
  arrays_type *local_268;
  ParameterBuilder *local_260;
  char *local_258;
  arrays_type *local_250;
  Token local_248;
  arrays_type *local_238;
  string_view local_230;
  arrays_type *local_220;
  arrays_type *local_218;
  int local_20c;
  undefined8 local_208;
  char cStack_200;
  char cStack_1ff;
  char cStack_1fe;
  char cStack_1fd;
  char cStack_1fc;
  char cStack_1fb;
  char cStack_1fa;
  char cStack_1f9;
  undefined8 local_1f8;
  char cStack_1f0;
  char cStack_1ef;
  char cStack_1ee;
  char cStack_1ed;
  char cStack_1ec;
  char cStack_1eb;
  char cStack_1ea;
  char cStack_1e9;
  undefined8 local_1e8;
  char cStack_1e0;
  char cStack_1df;
  char cStack_1de;
  char cStack_1dd;
  char cStack_1dc;
  char cStack_1db;
  char cStack_1da;
  char cStack_1d9;
  arrays_type *local_1d0;
  pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool> local_1c8;
  undefined1 *local_1b8;
  arrays_type *local_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0 [40];
  undefined1 local_178 [256];
  Storage *local_78;
  table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
  local_70;
  
  local_20c = (int)CONCAT71(in_register_00000011,isFromConfig);
  if ((local_20c != 0) && ((syntax->parameters).elements._M_extent._M_extent_value == 0)) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
    ::clear((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
             *)&(this->assignments).super_Storage.field_0x108);
    return;
  }
  local_1b8 = local_1a0;
  local_1b0 = (arrays_type *)0x0;
  local_1a8 = 5;
  local_78 = (Storage *)local_178;
  local_70.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
  .arrays.groups_size_index = 0x3f;
  local_70.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
  .arrays.groups_size_mask = 1;
  local_70.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  ppVar11 = local_70.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
            .arrays.elements_;
  local_70.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  local_70.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  ppVar10 = local_70.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
            .arrays.elements_;
  local_70.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  local_70.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
  .size_ctrl.ml = 0;
  local_70.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
  .size_ctrl.size = 0;
  uVar13 = (syntax->parameters).elements._M_extent._M_extent_value + 1;
  local_260 = this;
  local_70.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
  .
  super_empty_value<slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>,_2U,_false>
  .value_.storage =
       (StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>
        )(StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>
          )local_78;
  if (1 < uVar13) {
    local_288 = (pointer)(uVar13 >> 1);
    local_1f8 = (undefined1 *)CONCAT71(local_1f8._1_7_,1);
    local_208 = (arrays_type *)0x0;
    lVar38 = 0;
    paVar21 = (arrays_type *)
              local_70.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
              .arrays.elements_;
    local_70.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
    .arrays.elements_ = ppVar10;
    do {
      ppSVar14 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            ((syntax->parameters).elements._M_ptr + lVar38 * 2));
      this_00 = (NamedParamAssignmentSyntax *)*ppSVar14;
      SVar2 = (this_00->super_ParamAssignmentSyntax).super_SyntaxNode.kind;
      uVar22 = (undefined7)((ulong)paVar21 >> 8);
      if (((ulong)local_208 & 1) == 0) {
        local_1f8 = (undefined1 *)CONCAT71(local_1f8._1_7_,SVar2 == OrderedParamAssignment);
        paVar21 = (arrays_type *)CONCAT71(uVar22,1);
        local_208 = paVar21;
LAB_002ebcbe:
        if (SVar2 == OrderedParamAssignment) {
          local_248._0_8_ = this_00;
          SmallVectorBase<slang::syntax::OrderedParamAssignmentSyntax_const*>::
          emplace_back<slang::syntax::OrderedParamAssignmentSyntax_const*>
                    ((SmallVectorBase<slang::syntax::OrderedParamAssignmentSyntax_const*> *)
                     &local_1b8,(OrderedParamAssignmentSyntax **)&local_248);
        }
        else {
          local_230 = parsing::Token::valueText(&this_00->name);
          if (local_230._M_len != 0) {
            local_1c8.second = false;
            local_1c8.first = this_00;
            local_2a9._17_8_ =
                 hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            &local_70,&local_230);
            paVar27 = (arrays_type *)
                      ((ulong)local_2a9._17_8_ >>
                      ((byte)local_70.
                             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
                             .arrays.groups_size_index & 0x3f));
            lVar5 = (local_2a9._17_8_ & 0xff) * 4;
            cVar48 = (&UNK_0051605c)[lVar5];
            cVar49 = (&UNK_0051605d)[lVar5];
            cVar50 = (&UNK_0051605e)[lVar5];
            cVar51 = (&UNK_0051605f)[lVar5];
            sVar4 = local_230._M_len;
            local_258 = local_230._M_str;
            paVar29 = (arrays_type *)(ulong)((uint)local_2a9._17_8_ & 7);
            paVar32 = (arrays_type *)0x0;
            local_270 = (arrays_type *)
                        local_70.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
                        .arrays.elements_;
            paVar23 = (arrays_type *)
                      local_70.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
                      .arrays.groups_;
            paVar16 = (arrays_type *)
                      local_70.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
                      .arrays.groups_size_mask;
            cVar52 = cVar48;
            cVar53 = cVar49;
            cVar54 = cVar50;
            cVar55 = cVar51;
            cVar56 = cVar48;
            cVar57 = cVar49;
            cVar58 = cVar50;
            cVar59 = cVar51;
            cVar60 = cVar48;
            cVar61 = cVar49;
            cVar62 = cVar50;
            cVar63 = cVar51;
            local_268 = paVar27;
            do {
              paVar35 = local_270;
              paVar34 = (arrays_type *)((long)paVar27 * 0x10);
              pcVar30 = (char *)((long)&paVar34->groups_size_index +
                                (long)&paVar23->groups_size_index);
              auVar43[0] = -(*pcVar30 == cVar48);
              auVar43[1] = -(pcVar30[1] == cVar49);
              auVar43[2] = -(pcVar30[2] == cVar50);
              auVar43[3] = -(pcVar30[3] == cVar51);
              auVar43[4] = -(pcVar30[4] == cVar52);
              auVar43[5] = -(pcVar30[5] == cVar53);
              auVar43[6] = -(pcVar30[6] == cVar54);
              auVar43[7] = -(pcVar30[7] == cVar55);
              auVar43[8] = -(pcVar30[8] == cVar56);
              auVar43[9] = -(pcVar30[9] == cVar57);
              auVar43[10] = -(pcVar30[10] == cVar58);
              auVar43[0xb] = -(pcVar30[0xb] == cVar59);
              auVar43[0xc] = -(pcVar30[0xc] == cVar60);
              auVar43[0xd] = -(pcVar30[0xd] == cVar61);
              auVar43[0xe] = -(pcVar30[0xe] == cVar62);
              auVar43[0xf] = -(pcVar30[0xf] == cVar63);
              uVar20 = (uint)(ushort)((ushort)(SUB161(auVar43 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe);
              paVar21 = local_270;
              paVar26 = paVar27;
              paVar33 = paVar32;
              if (uVar20 != 0) {
                local_1e8 = (arrays_type *)
                            CONCAT17(cVar55,CONCAT16(cVar54,CONCAT15(cVar53,CONCAT14(cVar52,CONCAT13
                                                  (cVar51,CONCAT12(cVar50,CONCAT11(cVar49,cVar48))))
                                                  )));
                local_2a9._9_8_ = paVar29;
                local_2a9._25_8_ = syntax;
                local_280 = paVar16;
                local_278 = paVar23;
                local_250 = paVar27;
                local_220 = paVar34;
                local_218 = paVar32;
                cStack_1e0 = cVar56;
                cStack_1df = cVar57;
                cStack_1de = cVar58;
                cStack_1dd = cVar59;
                cStack_1dc = cVar60;
                cStack_1db = cVar61;
                cStack_1da = cVar62;
                cStack_1d9 = cVar63;
                do {
                  paVar21 = (arrays_type *)CONCAT71((int7)((ulong)paVar21 >> 8),sVar4 == 0);
                  iVar12 = 0;
                  if (uVar20 != 0) {
                    for (; (uVar20 >> iVar12 & 1) == 0; iVar12 = iVar12 + 1) {
                    }
                  }
                  bVar42 = sVar4 == *(size_t *)
                                     ((long)&paVar35[(long)paVar27 * 0xf].groups_size_index +
                                     (ulong)(uint)(iVar12 << 5));
                  paVar23 = (arrays_type *)
                            ((long)&paVar35[(long)paVar27 * 0xf].groups_size_index +
                            (ulong)(uint)(iVar12 << 5));
                  if (bVar42 && sVar4 != 0) {
                    iVar12 = bcmp(local_258,(void *)paVar23->groups_size_mask,sVar4);
                    bVar42 = iVar12 == 0;
                    cVar48 = (char)local_1e8;
                    cVar49 = local_1e8._1_1_;
                    cVar50 = local_1e8._2_1_;
                    cVar51 = local_1e8._3_1_;
                    cVar52 = local_1e8._4_1_;
                    cVar53 = local_1e8._5_1_;
                    cVar54 = local_1e8._6_1_;
                    cVar55 = local_1e8._7_1_;
                    cVar56 = cStack_1e0;
                    cVar57 = cStack_1df;
                    cVar58 = cStack_1de;
                    cVar59 = cStack_1dd;
                    cVar60 = cStack_1dc;
                    cVar61 = cStack_1db;
                    cVar62 = cStack_1da;
                    cVar63 = cStack_1d9;
                  }
                  syntax = (ParameterValueAssignmentSyntax *)local_2a9._25_8_;
                  paVar29 = paVar23;
                  if (bVar42) goto LAB_002ebf08;
                  uVar20 = uVar20 - 1 & uVar20;
                  paVar21 = (arrays_type *)(ulong)uVar20;
                  paVar26 = local_250;
                  paVar23 = local_278;
                  paVar29 = (arrays_type *)local_2a9._9_8_;
                  paVar16 = local_280;
                  paVar33 = local_218;
                  paVar34 = local_220;
                } while (uVar20 != 0);
              }
              if ((*(byte *)((long)&paVar23->groups_size_mask +
                            (long)((long)&paVar34->groups_size_index + 7)) &
                  *(byte *)&paVar29[0x28b22].groups_) == 0) break;
              paVar32 = (arrays_type *)((long)&paVar33->groups_size_index + 1);
              paVar27 = (arrays_type *)
                        ((ulong)((long)&paVar33->groups_size_index +
                                (long)((long)&paVar26->groups_size_index + 1)) & (ulong)paVar16);
              paVar21 = local_270;
            } while (paVar32 <= paVar16);
            paVar23 = (arrays_type *)0x0;
            paVar29 = (arrays_type *)local_2a9._1_8_;
LAB_002ebf08:
            local_2a9._1_8_ = paVar29;
            paVar29 = paVar23;
            if (paVar23 == (arrays_type *)0x0) {
              if (local_70.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
                  .size_ctrl.size <
                  local_70.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
                  .size_ctrl.ml) {
                paVar21 = local_268;
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,256ul,16ul>>
                ::
                nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>
                          ((locator *)&local_248,
                           (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,256ul,16ul>>
                            *)&local_70,
                           &local_70.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
                            .arrays,(size_t)local_268,local_2a9._17_8_,
                           (try_emplace_args_t *)local_2a9,&local_230,&local_1c8);
                local_70.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
                .size_ctrl.size =
                     local_70.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
                     .size_ctrl.size + 1;
                paVar29 = local_238;
              }
              else {
                paVar21 = (arrays_type *)local_2a9;
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,256ul,16ul>>
                ::
                unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>
                          ((locator *)&local_248,
                           (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,256ul,16ul>>
                            *)&local_70,local_2a9._17_8_,(try_emplace_args_t *)paVar21,&local_230,
                           &local_1c8);
                paVar29 = local_238;
              }
            }
            local_2a9._1_8_ = paVar23;
            if (paVar23 != (arrays_type *)0x0) {
              pSVar3 = local_260->scope;
              SVar15 = parsing::Token::location(&this_00->name);
              pDVar17 = Scope::addDiag(pSVar3,(DiagCode)0x320006,SVar15);
              Diagnostic::operator<<(pDVar17,local_230);
              SVar15 = parsing::Token::location((Token *)(paVar29->groups_[2].m + 8));
              Diagnostic::addNote(pDVar17,(DiagCode)0xc0001,SVar15);
            }
          }
        }
        bVar42 = false;
      }
      else {
        paVar21 = (arrays_type *)CONCAT71(uVar22,SVar2 == OrderedParamAssignment);
        if ((SVar2 == OrderedParamAssignment) == (bool)((byte)local_1f8 & 1)) goto LAB_002ebcbe;
        pSVar3 = local_260->scope;
        local_248 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)this_00);
        SVar15 = parsing::Token::location(&local_248);
        Scope::addDiag(pSVar3,(DiagCode)0x7f0006,SVar15);
        bVar42 = true;
      }
    } while ((!bVar42) && (lVar38 = lVar38 + 1, (pointer)lVar38 != local_288));
    ppVar11 = local_70.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
              .arrays.elements_;
    if (((ulong)local_1f8 & 1) == 0) {
      sVar4 = (local_260->parameterDecls)._M_extent._M_extent_value;
      pPVar40 = local_260;
      if (sVar4 != 0) {
        pPVar37 = (local_260->parameterDecls)._M_ptr;
        pPVar36 = (ParameterValueAssignmentSyntax *)(pPVar37 + sVar4);
        local_280 = (arrays_type *)&(local_260->assignments).super_Storage.field_0x108;
        local_250 = (arrays_type *)&(local_260->assignments).field_0x110;
        local_2a9._25_8_ = pPVar36;
        do {
          local_2a9._1_8_ = &pPVar37->name;
          uVar18 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              &local_70,
                              (basic_string_view<char,_std::char_traits<char>_> *)local_2a9._1_8_);
          pcVar30 = (char *)(uVar18 >>
                            ((byte)local_70.
                                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
                                   .arrays.groups_size_index & 0x3f));
          lVar38 = (uVar18 & 0xff) * 4;
          cVar48 = (&UNK_0051605c)[lVar38];
          cVar49 = (&UNK_0051605d)[lVar38];
          cVar50 = (&UNK_0051605e)[lVar38];
          cVar51 = (&UNK_0051605f)[lVar38];
          local_1f8 = (undefined1 *)(ulong)((uint)uVar18 & 7);
          paVar16 = (arrays_type *)0x0;
          paVar21 = (arrays_type *)
                    local_70.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
                    .arrays.groups_size_mask;
          paVar23 = (arrays_type *)
                    local_70.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
                    .arrays.groups_;
          paVar29 = (arrays_type *)
                    local_70.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
                    .arrays.elements_;
          cVar52 = cVar48;
          cVar53 = cVar49;
          cVar54 = cVar50;
          cVar55 = cVar51;
          cVar56 = cVar48;
          cVar57 = cVar49;
          cVar58 = cVar50;
          cVar59 = cVar51;
          cVar60 = cVar48;
          cVar61 = cVar49;
          cVar62 = cVar50;
          cVar63 = cVar51;
          do {
            paVar35 = (arrays_type *)((long)pcVar30 * 0x10);
            pcVar31 = (char *)((long)&paVar35->groups_size_index + (long)&paVar23->groups_size_index
                              );
            auVar45[0] = -(*pcVar31 == cVar48);
            auVar45[1] = -(pcVar31[1] == cVar49);
            auVar45[2] = -(pcVar31[2] == cVar50);
            auVar45[3] = -(pcVar31[3] == cVar51);
            auVar45[4] = -(pcVar31[4] == cVar52);
            auVar45[5] = -(pcVar31[5] == cVar53);
            auVar45[6] = -(pcVar31[6] == cVar54);
            auVar45[7] = -(pcVar31[7] == cVar55);
            auVar45[8] = -(pcVar31[8] == cVar56);
            auVar45[9] = -(pcVar31[9] == cVar57);
            auVar45[10] = -(pcVar31[10] == cVar58);
            auVar45[0xb] = -(pcVar31[0xb] == cVar59);
            auVar45[0xc] = -(pcVar31[0xc] == cVar60);
            auVar45[0xd] = -(pcVar31[0xd] == cVar61);
            auVar45[0xe] = -(pcVar31[0xe] == cVar62);
            auVar45[0xf] = -(pcVar31[0xf] == cVar63);
            uVar20 = (uint)(ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe);
            pcVar31 = pcVar30;
            paVar27 = paVar29;
            paVar32 = paVar16;
            if (uVar20 != 0) {
              pgVar6 = (group_type_pointer)(pPVar37->name)._M_len;
              ppVar7 = (value_type_pointer)(pPVar37->name)._M_str;
              local_208._0_2_ = CONCAT11(cVar49,cVar48);
              local_208._0_3_ = CONCAT12(cVar50,(undefined2)local_208);
              local_208._0_4_ = CONCAT13(cVar51,(undefined3)local_208);
              local_208._0_5_ = CONCAT14(cVar52,(undefined4)local_208);
              local_208._0_6_ = CONCAT15(cVar53,(undefined5)local_208);
              local_208._0_7_ = CONCAT16(cVar54,(undefined6)local_208);
              local_208 = (arrays_type *)CONCAT17(cVar55,(undefined7)local_208);
              local_2a9._17_8_ = paVar29;
              local_288 = pPVar37;
              local_278 = paVar35;
              local_270 = paVar16;
              local_268 = paVar21;
              local_258 = pcVar30;
              cStack_200 = cVar56;
              cStack_1ff = cVar57;
              cStack_1fe = cVar58;
              cStack_1fd = cVar59;
              cStack_1fc = cVar60;
              cStack_1fb = cVar61;
              cStack_1fa = cVar62;
              cStack_1f9 = cVar63;
              local_1e8 = paVar23;
              do {
                iVar12 = 0;
                if (uVar20 != 0) {
                  for (; (uVar20 >> iVar12 & 1) == 0; iVar12 = iVar12 + 1) {
                  }
                }
                bVar42 = pgVar6 == *(group_type_pointer *)
                                    ((long)&paVar29[(long)pcVar30 * 0xf].groups_size_index +
                                    (ulong)(uint)(iVar12 << 5));
                puVar39 = (undefined1 *)
                          ((long)&paVar29[(long)pcVar30 * 0xf].groups_size_index +
                          (ulong)(uint)(iVar12 << 5));
                if (bVar42 && pgVar6 != (group_type_pointer)0x0) {
                  iVar12 = bcmp(ppVar7,*(void **)(puVar39 + 8),(size_t)pgVar6);
                  bVar42 = iVar12 == 0;
                  cVar48 = (char)local_208;
                  cVar49 = local_208._1_1_;
                  cVar50 = local_208._2_1_;
                  cVar51 = local_208._3_1_;
                  cVar52 = local_208._4_1_;
                  cVar53 = local_208._5_1_;
                  cVar54 = local_208._6_1_;
                  cVar55 = local_208._7_1_;
                  cVar56 = cStack_200;
                  cVar57 = cStack_1ff;
                  cVar58 = cStack_1fe;
                  cVar59 = cStack_1fd;
                  cVar60 = cStack_1fc;
                  cVar61 = cStack_1fb;
                  cVar62 = cStack_1fa;
                  cVar63 = cStack_1f9;
                }
                pPVar36 = (ParameterValueAssignmentSyntax *)local_2a9._25_8_;
                pPVar37 = local_288;
                if (bVar42) goto LAB_002ec5b6;
                uVar20 = uVar20 - 1 & uVar20;
                paVar21 = local_268;
                pcVar31 = local_258;
                paVar23 = local_1e8;
                paVar27 = (arrays_type *)local_2a9._17_8_;
                paVar32 = local_270;
                paVar35 = local_278;
              } while (uVar20 != 0);
            }
            if ((*(byte *)((long)&paVar23->groups_size_mask +
                          (long)((long)&paVar35->groups_size_index + 7)) &
                (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::
                  is_not_overflowed(unsigned_long)::shift)[(long)local_1f8]) == 0) break;
            paVar16 = (arrays_type *)((long)&paVar32->groups_size_index + 1);
            pcVar30 = (char *)((ulong)(pcVar31 + (long)paVar32 + 1) & (ulong)paVar21);
            paVar29 = paVar27;
          } while (paVar16 <= paVar21);
          puVar39 = (undefined1 *)0x0;
LAB_002ec5b6:
          pPVar40 = local_260;
          local_1f8 = puVar39;
          if (puVar39 != (undefined1 *)0x0) {
            puVar39[0x18] = 1;
            if (pPVar37->isLocalParam == true) {
              bVar42 = pPVar37->isPortParam;
              pSVar3 = local_260->scope;
              SVar15 = parsing::Token::location((Token *)(*(long *)(puVar39 + 0x10) + 0x28));
              pDVar17 = Scope::addDiag(pSVar3,(DiagCode)((uint)bVar42 * 0x10000 + 0x30006),SVar15);
              Diagnostic::addNote(pDVar17,(DiagCode)0x50001,pPVar37->location);
            }
            else {
              paVar21 = *(arrays_type **)(*(long *)(puVar39 + 0x10) + 0x48);
              local_288 = pPVar37;
              local_2a9._17_8_ =
                   hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              local_280,
                              (basic_string_view<char,_std::char_traits<char>_> *)local_2a9._1_8_);
              paVar29 = (arrays_type *)
                        ((ulong)local_2a9._17_8_ >> ((pPVar40->assignments).field_0x110 & 0x3f));
              local_258 = *(char **)&(pPVar40->assignments).field_0x120;
              lVar38 = (local_2a9._17_8_ & 0xff) * 4;
              cVar48 = (&UNK_0051605c)[lVar38];
              cVar49 = (&UNK_0051605d)[lVar38];
              cVar50 = (&UNK_0051605e)[lVar38];
              cVar51 = (&UNK_0051605f)[lVar38];
              local_220 = *(arrays_type **)&(pPVar40->assignments).field_0x128;
              local_1e8 = (arrays_type *)(ulong)((uint)local_2a9._17_8_ & 7);
              local_1d0 = *(arrays_type **)&(pPVar40->assignments).field_0x118;
              paVar23 = (arrays_type *)0x0;
              cVar52 = cVar48;
              cVar53 = cVar49;
              cVar54 = cVar50;
              cVar55 = cVar51;
              cVar56 = cVar48;
              cVar57 = cVar49;
              cVar58 = cVar50;
              cVar59 = cVar51;
              cVar60 = cVar48;
              cVar61 = cVar49;
              cVar62 = cVar50;
              cVar63 = cVar51;
              local_268 = paVar29;
              do {
                paVar16 = local_220;
                pcVar30 = local_258 + (long)paVar29 * 0x10;
                auVar46[0] = -(*pcVar30 == cVar48);
                auVar46[1] = -(pcVar30[1] == cVar49);
                auVar46[2] = -(pcVar30[2] == cVar50);
                auVar46[3] = -(pcVar30[3] == cVar51);
                auVar46[4] = -(pcVar30[4] == cVar52);
                auVar46[5] = -(pcVar30[5] == cVar53);
                auVar46[6] = -(pcVar30[6] == cVar54);
                auVar46[7] = -(pcVar30[7] == cVar55);
                auVar46[8] = -(pcVar30[8] == cVar56);
                auVar46[9] = -(pcVar30[9] == cVar57);
                auVar46[10] = -(pcVar30[10] == cVar58);
                auVar46[0xb] = -(pcVar30[0xb] == cVar59);
                auVar46[0xc] = -(pcVar30[0xc] == cVar60);
                auVar46[0xd] = -(pcVar30[0xd] == cVar61);
                auVar46[0xe] = -(pcVar30[0xe] == cVar62);
                auVar46[0xf] = -(pcVar30[0xf] == cVar63);
                uVar20 = (uint)(ushort)((ushort)(SUB161(auVar46 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe);
                local_278 = paVar29;
                local_218 = paVar23;
                if (uVar20 != 0) {
                  pgVar6 = (group_type_pointer)(local_288->name)._M_len;
                  ppVar7 = (value_type_pointer)(local_288->name)._M_str;
                  local_208._0_2_ = CONCAT11(cVar49,cVar48);
                  local_208._0_3_ = CONCAT12(cVar50,(undefined2)local_208);
                  local_208._0_4_ = CONCAT13(cVar51,(undefined3)local_208);
                  local_208._0_5_ = CONCAT14(cVar52,(undefined4)local_208);
                  local_208._0_6_ = CONCAT15(cVar53,(undefined5)local_208);
                  local_208._0_7_ = CONCAT16(cVar54,(undefined6)local_208);
                  local_208 = (arrays_type *)CONCAT17(cVar55,(undefined7)local_208);
                  local_270 = paVar21;
                  cStack_200 = cVar56;
                  cStack_1ff = cVar57;
                  cStack_1fe = cVar58;
                  cStack_1fd = cVar59;
                  cStack_1fc = cVar60;
                  cStack_1fb = cVar61;
                  cStack_1fa = cVar62;
                  cStack_1f9 = cVar63;
                  do {
                    iVar12 = 0;
                    if (uVar20 != 0) {
                      for (; (uVar20 >> iVar12 & 1) == 0; iVar12 = iVar12 + 1) {
                      }
                    }
                    bVar42 = pgVar6 == *(group_type_pointer *)
                                        ((long)&paVar16[(long)paVar29 * 0xf].groups_size_index +
                                        (ulong)(uint)(iVar12 << 5));
                    paVar23 = (arrays_type *)
                              ((long)&paVar16[(long)paVar29 * 0xf].groups_size_index +
                              (ulong)(uint)(iVar12 << 5));
                    if (bVar42 && pgVar6 != (group_type_pointer)0x0) {
                      iVar12 = bcmp(ppVar7,(void *)paVar23->groups_size_mask,(size_t)pgVar6);
                      bVar42 = iVar12 == 0;
                      cVar48 = (char)local_208;
                      cVar49 = local_208._1_1_;
                      cVar50 = local_208._2_1_;
                      cVar51 = local_208._3_1_;
                      cVar52 = local_208._4_1_;
                      cVar53 = local_208._5_1_;
                      cVar54 = local_208._6_1_;
                      cVar55 = local_208._7_1_;
                      cVar56 = cStack_200;
                      cVar57 = cStack_1ff;
                      cVar58 = cStack_1fe;
                      cVar59 = cStack_1fd;
                      cVar60 = cStack_1fc;
                      cVar61 = cStack_1fb;
                      cVar62 = cStack_1fa;
                      cVar63 = cStack_1f9;
                    }
                    paVar21 = local_270;
                    pPVar36 = (ParameterValueAssignmentSyntax *)local_2a9._25_8_;
                    pPVar40 = local_260;
                    paVar27 = paVar23;
                    if (bVar42) goto LAB_002ec7f4;
                    uVar20 = uVar20 - 1 & uVar20;
                  } while (uVar20 != 0);
                }
                if ((local_258[(long)paVar29 * 0x10 + 0xf] & *(byte *)&local_1e8[0x28b22].groups_)
                    == 0) break;
                paVar23 = (arrays_type *)((long)&local_218->groups_size_index + 1);
                paVar29 = (arrays_type *)
                          ((ulong)((long)&local_218->groups_size_index +
                                  (long)((long)&local_278->groups_size_index + 1)) &
                          (ulong)local_1d0);
              } while (paVar23 <= local_1d0);
              paVar23 = (arrays_type *)0x0;
              paVar27 = (arrays_type *)local_2a9._9_8_;
LAB_002ec7f4:
              local_2a9._9_8_ = paVar27;
              pPVar37 = local_288;
              paVar29 = paVar23;
              if (paVar23 == (arrays_type *)0x0) {
                if (*(ulong *)&(pPVar40->assignments).field_0x138 <
                    *(ulong *)&(pPVar40->assignments).field_0x130) {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
                  ::
                  nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                            ((locator *)&local_248,
                             (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
                              *)local_280,local_250,(size_t)local_268,local_2a9._17_8_,
                             (try_emplace_args_t *)&local_230,
                             (basic_string_view<char,_std::char_traits<char>_> *)local_2a9._1_8_);
                  puVar39 = &(pPVar40->assignments).field_0x138;
                  *(long *)puVar39 = *(long *)puVar39 + 1;
                  paVar29 = local_238;
                }
                else {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
                  ::
                  unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                            ((locator *)&local_248,
                             (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
                              *)local_280,local_2a9._17_8_,(try_emplace_args_t *)&local_230,
                             (basic_string_view<char,_std::char_traits<char>_> *)local_2a9._1_8_);
                  paVar29 = local_238;
                }
              }
              paVar29->groups_ = (group_type_pointer)paVar21;
              *(char *)&paVar29->elements_ = (char)local_20c;
              local_2a9._9_8_ = paVar23;
            }
          }
          pPVar37 = pPVar37 + 1;
        } while ((ParameterValueAssignmentSyntax *)pPVar37 != pPVar36);
      }
      iVar64 = boost::unordered::detail::foa::
               table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
               ::begin(&local_70);
      if (iVar64.p_ != (table_element_pointer)0x0) {
LAB_002ec8ac:
        if ((((iVar64.p_)->second).second & 1U) == 0) {
          pSVar3 = pPVar40->scope;
          this_01 = &(((iVar64.p_)->second).first)->name;
          SVar15 = parsing::Token::location(this_01);
          pDVar17 = Scope::addDiag(pSVar3,(DiagCode)0x990006,SVar15);
          arg = parsing::Token::valueText(this_01);
          Diagnostic::operator<<(pDVar17,arg);
          Diagnostic::operator<<(pDVar17,pPVar40->definitionName);
        }
        puVar19 = iVar64.pc_ + 2;
        do {
          puVar25 = puVar19;
          puVar19 = iVar64.pc_;
          ppVar41 = iVar64.p_ + 1;
          if (((uint)iVar64.pc_ & 0xf) == 0xe) goto LAB_002ec93b;
          puVar1 = puVar25 + -1;
          iVar64.p_ = ppVar41;
          iVar64.pc_ = puVar19 + 1;
          puVar19 = puVar25 + 1;
        } while (*puVar1 == '\0');
        puVar25 = puVar25 + -1;
        if (*puVar1 == '\x01') {
          ppVar41 = (table_element_pointer)0x0;
        }
        goto LAB_002ec928;
      }
      goto LAB_002ec395;
    }
  }
  local_70.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
  .arrays.elements_ = ppVar11;
  sVar4 = (local_260->parameterDecls)._M_extent._M_extent_value;
  paVar21 = (arrays_type *)0x0;
  pPVar40 = local_260;
  if (sVar4 != 0) {
    pPVar37 = (local_260->parameterDecls)._M_ptr;
    pPVar24 = pPVar37 + sVar4;
    paVar23 = (arrays_type *)&(local_260->assignments).super_Storage.field_0x108;
    paVar29 = (arrays_type *)&(local_260->assignments).field_0x110;
    do {
      iVar12 = 4;
      if (((arrays_type *)((ulong)paVar21 & 0xffffffff) < local_1b0) &&
         (iVar12 = 5, pPVar37->isLocalParam == false)) {
        paVar16 = (arrays_type *)(ulong)((int)paVar21 + 1);
        local_2a9._25_8_ =
             *(undefined8 *)(*(long *)(local_1b8 + (long)((ulong)paVar21 & 0xffffffff) * 8) + 0x18);
        local_2a9._17_8_ = &pPVar37->name;
        local_268 = (arrays_type *)
                    hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                              ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                               paVar23,(basic_string_view<char,_std::char_traits<char>_> *)
                                       local_2a9._17_8_);
        paVar27 = (arrays_type *)((ulong)local_268 >> ((pPVar40->assignments).field_0x110 & 0x3f));
        lVar5 = *(long *)&(pPVar40->assignments).field_0x120;
        lVar38 = ((ulong)local_268 & 0xff) * 4;
        cVar48 = (&UNK_0051605c)[lVar38];
        cVar49 = (&UNK_0051605d)[lVar38];
        cVar50 = (&UNK_0051605e)[lVar38];
        cVar51 = (&UNK_0051605f)[lVar38];
        local_1e8 = *(arrays_type **)&(pPVar40->assignments).field_0x128;
        paVar21 = (arrays_type *)(ulong)((uint)local_268 & 7);
        local_220 = *(arrays_type **)&(pPVar40->assignments).field_0x118;
        local_250 = (arrays_type *)0x0;
        cVar52 = cVar48;
        cVar53 = cVar49;
        cVar54 = cVar50;
        cVar55 = cVar51;
        cVar56 = cVar48;
        cVar57 = cVar49;
        cVar58 = cVar50;
        cVar59 = cVar51;
        cVar60 = cVar48;
        cVar61 = cVar49;
        cVar62 = cVar50;
        cVar63 = cVar51;
        local_270 = paVar27;
        do {
          local_258 = (char *)((long)paVar27 * 0x10);
          pcVar30 = local_258 + lVar5;
          auVar44[0] = -(*pcVar30 == cVar48);
          auVar44[1] = -(pcVar30[1] == cVar49);
          auVar44[2] = -(pcVar30[2] == cVar50);
          auVar44[3] = -(pcVar30[3] == cVar51);
          auVar44[4] = -(pcVar30[4] == cVar52);
          auVar44[5] = -(pcVar30[5] == cVar53);
          auVar44[6] = -(pcVar30[6] == cVar54);
          auVar44[7] = -(pcVar30[7] == cVar55);
          auVar44[8] = -(pcVar30[8] == cVar56);
          auVar44[9] = -(pcVar30[9] == cVar57);
          auVar44[10] = -(pcVar30[10] == cVar58);
          auVar44[0xb] = -(pcVar30[0xb] == cVar59);
          auVar44[0xc] = -(pcVar30[0xc] == cVar60);
          auVar44[0xd] = -(pcVar30[0xd] == cVar61);
          auVar44[0xe] = -(pcVar30[0xe] == cVar62);
          auVar44[0xf] = -(pcVar30[0xf] == cVar63);
          uVar20 = (uint)(ushort)((ushort)(SUB161(auVar44 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar44 >> 0x77,0) & 1) << 0xe);
          local_218 = paVar27;
          if (uVar20 != 0) {
            pPVar28 = (pointer)(local_1e8 + (long)paVar27 * 0xf);
            __n = (pPVar37->name)._M_len;
            local_2a9._1_8_ = (pPVar37->name)._M_str;
            local_1f8 = (undefined1 *)
                        CONCAT17(cVar55,CONCAT16(cVar54,CONCAT15(cVar53,CONCAT14(cVar52,CONCAT13(
                                                  cVar51,CONCAT12(cVar50,CONCAT11(cVar49,cVar48)))))
                                                ));
            local_2a9._9_8_ = paVar23;
            local_288 = pPVar28;
            local_280 = paVar29;
            local_278 = paVar16;
            cStack_1f0 = cVar56;
            cStack_1ef = cVar57;
            cStack_1ee = cVar58;
            cStack_1ed = cVar59;
            cStack_1ec = cVar60;
            cStack_1eb = cVar61;
            cStack_1ea = cVar62;
            cStack_1e9 = cVar63;
            local_1d0 = paVar21;
            do {
              iVar12 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> iVar12 & 1) == 0; iVar12 = iVar12 + 1) {
                }
              }
              bVar42 = __n == *(size_t *)((long)&pPVar28->field_0 + (ulong)(uint)(iVar12 << 5));
              paVar16 = (arrays_type *)((long)&pPVar28->field_0 + (ulong)(uint)(iVar12 << 5));
              if (bVar42 && __n != 0) {
                iVar12 = bcmp((void *)local_2a9._1_8_,(void *)paVar16->groups_size_mask,__n);
                bVar42 = iVar12 == 0;
                pPVar28 = local_288;
                cVar48 = (byte)local_1f8;
                cVar49 = local_1f8._1_1_;
                cVar50 = local_1f8._2_1_;
                cVar51 = local_1f8._3_1_;
                cVar52 = local_1f8._4_1_;
                cVar53 = local_1f8._5_1_;
                cVar54 = local_1f8._6_1_;
                cVar55 = local_1f8._7_1_;
                cVar56 = cStack_1f0;
                cVar57 = cStack_1ef;
                cVar58 = cStack_1ee;
                cVar59 = cStack_1ed;
                cVar60 = cStack_1ec;
                cVar61 = cStack_1eb;
                cVar62 = cStack_1ea;
                cVar63 = cStack_1e9;
              }
              paVar29 = local_280;
              paVar23 = (arrays_type *)local_2a9._9_8_;
              pPVar40 = local_260;
              paVar21 = local_278;
              if (bVar42) goto LAB_002ec277;
              uVar20 = uVar20 - 1 & uVar20;
              paVar21 = local_1d0;
              paVar16 = local_278;
            } while (uVar20 != 0);
          }
          if ((local_258[lVar5 + 0xf] & *(byte *)&paVar21[0x28b22].groups_) == 0) break;
          psVar9 = &local_250->groups_size_index;
          local_250 = (arrays_type *)((long)&local_250->groups_size_index + 1);
          paVar27 = (arrays_type *)
                    ((ulong)((long)psVar9 + (long)((long)&local_218->groups_size_index + 1)) &
                    (ulong)local_220);
        } while (local_250 <= local_220);
        local_208 = (arrays_type *)0x0;
        paVar21 = paVar16;
        paVar16 = local_208;
LAB_002ec277:
        local_208 = paVar16;
        paVar16 = local_208;
        if (local_208 == (arrays_type *)0x0) {
          if (*(ulong *)&(pPVar40->assignments).field_0x138 <
              *(ulong *)&(pPVar40->assignments).field_0x130) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
            ::
            nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                      ((locator *)&local_248,
                       (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
                        *)paVar23,paVar29,(size_t)local_270,(size_t)local_268,
                       (try_emplace_args_t *)&local_230,
                       (basic_string_view<char,_std::char_traits<char>_> *)local_2a9._17_8_);
            puVar39 = &(pPVar40->assignments).field_0x138;
            *(long *)puVar39 = *(long *)puVar39 + 1;
            paVar16 = local_238;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                      ((locator *)&local_248,
                       (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
                        *)paVar23,(size_t)local_268,(try_emplace_args_t *)&local_230,
                       (basic_string_view<char,_std::char_traits<char>_> *)local_2a9._17_8_);
            paVar16 = local_238;
          }
        }
        paVar16->groups_ = (group_type_pointer)local_2a9._25_8_;
        *(char *)&paVar16->elements_ = (char)local_20c;
        iVar12 = 0;
      }
    } while (((iVar12 == 5) || (iVar12 == 0)) && (pPVar37 = pPVar37 + 1, pPVar37 != pPVar24));
    paVar21 = (arrays_type *)((ulong)paVar21 & 0xffffffff);
  }
  if (paVar21 < local_1b0) {
    local_248 = slang::syntax::SyntaxNode::getFirstToken
                          (*(SyntaxNode **)(local_1b8 + (long)paVar21 * 8));
    SVar15 = parsing::Token::location(&local_248);
    pDVar17 = Scope::addDiag(pPVar40->scope,(DiagCode)0xc70006,SVar15);
    Diagnostic::operator<<(pDVar17,pPVar40->definitionName);
    local_248._0_8_ = local_1b0;
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ::emplace_back<unsigned_long>(&pDVar17->args,(unsigned_long *)&local_248);
    local_248._0_8_ = paVar21;
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ::emplace_back<unsigned_long>(&pDVar17->args,(unsigned_long *)&local_248);
  }
LAB_002ec395:
  boost::unordered::detail::foa::
  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::delete_(local_70.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
            .
            super_empty_value<slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>,_2U,_false>
            .value_.storage,
            &local_70.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL>_>
             .arrays);
  if (local_1b8 != local_1a0) {
    operator_delete(local_1b8);
  }
  return;
LAB_002ec93b:
  do {
    auVar47[0] = -(*puVar25 == '\0');
    auVar47[1] = -(puVar25[1] == '\0');
    auVar47[2] = -(puVar25[2] == '\0');
    auVar47[3] = -(puVar25[3] == '\0');
    auVar47[4] = -(puVar25[4] == '\0');
    auVar47[5] = -(puVar25[5] == '\0');
    auVar47[6] = -(puVar25[6] == '\0');
    auVar47[7] = -(puVar25[7] == '\0');
    auVar47[8] = -(puVar25[8] == '\0');
    auVar47[9] = -(puVar25[9] == '\0');
    auVar47[10] = -(puVar25[10] == '\0');
    auVar47[0xb] = -(puVar25[0xb] == '\0');
    auVar47[0xc] = -(puVar25[0xc] == '\0');
    auVar47[0xd] = -(puVar25[0xd] == '\0');
    auVar47[0xe] = -(puVar25[0xe] == '\0');
    auVar47[0xf] = -(puVar25[0xf] == '\0');
    uVar20 = (uint)(ushort)((ushort)(SUB161(auVar47 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe);
    if (uVar20 == 0x7fff) {
      puVar25 = puVar25 + 0x10;
      ppVar41 = ppVar41 + 0xf;
    }
    else {
      uVar8 = 0;
      if ((uVar20 ^ 0x7fff) != 0) {
        for (; ((uVar20 ^ 0x7fff) >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
        }
      }
      if (puVar25[uVar8] == '\x01') {
        ppVar41 = (table_element_pointer)0x0;
      }
      else {
        puVar25 = puVar25 + uVar8;
        ppVar41 = (table_element_pointer)((long)&(ppVar41->first)._M_len + (ulong)(uVar8 << 5));
      }
    }
  } while (uVar20 == 0x7fff);
LAB_002ec928:
  iVar64.p_ = ppVar41;
  iVar64.pc_ = puVar25;
  if (ppVar41 == (table_element_pointer)0x0) goto LAB_002ec395;
  goto LAB_002ec8ac;
}

Assistant:

void ParameterBuilder::setAssignments(const ParameterValueAssignmentSyntax& syntax,
                                      bool isFromConfig) {
    // Special case for config param assignments: if the assignment
    // syntax list is empty, we set all params back to their defaults.
    if (isFromConfig && syntax.parameters.empty()) {
        assignments.clear();
        return;
    }

    // Build up data structures to easily index the parameter assignments. We need to handle
    // both ordered assignment as well as named assignment, though a specific instance can only
    // use one method or the other.
    bool hasParamAssignments = false;
    bool orderedAssignments = true;
    SmallVector<const OrderedParamAssignmentSyntax*> orderedParams;
    SmallMap<std::string_view, std::pair<const NamedParamAssignmentSyntax*, bool>, 8> namedParams;

    for (auto paramBase : syntax.parameters) {
        bool isOrdered = paramBase->kind == SyntaxKind::OrderedParamAssignment;
        if (!hasParamAssignments) {
            hasParamAssignments = true;
            orderedAssignments = isOrdered;
        }
        else if (isOrdered != orderedAssignments) {
            scope.addDiag(diag::MixingOrderedAndNamedParams, paramBase->getFirstToken().location());
            break;
        }

        if (isOrdered)
            orderedParams.push_back(&paramBase->as<OrderedParamAssignmentSyntax>());
        else {
            auto& nas = paramBase->as<NamedParamAssignmentSyntax>();
            auto name = nas.name.valueText();
            if (!name.empty()) {
                auto pair = namedParams.emplace(name, std::make_pair(&nas, false));
                if (!pair.second) {
                    auto& diag = scope.addDiag(diag::DuplicateParamAssignment, nas.name.location());
                    diag << name;
                    diag.addNote(diag::NotePreviousUsage,
                                 pair.first->second.first->name.location());
                }
            }
        }
    }

    // For each parameter assignment we have, match it up to a real parameter
    if (orderedAssignments) {
        uint32_t orderedIndex = 0;
        for (auto& param : parameterDecls) {
            if (orderedIndex >= orderedParams.size())
                break;

            if (param.isLocalParam)
                continue;

            assignments[param.name] = {orderedParams[orderedIndex++]->expr, isFromConfig};
        }

        // Make sure there aren't extra param assignments for non-existent params.
        if (orderedIndex < orderedParams.size()) {
            auto loc = orderedParams[orderedIndex]->getFirstToken().location();
            auto& diag = scope.addDiag(diag::TooManyParamAssignments, loc);
            diag << definitionName;
            diag << orderedParams.size();
            diag << orderedIndex;
        }
    }
    else {
        // Otherwise handle named assignments.
        for (auto& param : parameterDecls) {
            auto it = namedParams.find(param.name);
            if (it == namedParams.end())
                continue;

            auto arg = it->second.first;
            it->second.second = true;
            if (param.isLocalParam) {
                // Can't assign to localparams, so this is an error.
                DiagCode code = param.isPortParam ? diag::AssignedToLocalPortParam
                                                  : diag::AssignedToLocalBodyParam;

                auto& diag = scope.addDiag(code, arg->name.location());
                diag.addNote(diag::NoteDeclarationHere, param.location);
                continue;
            }

            assignments[param.name] = {arg->expr, isFromConfig};
        }

        for (auto& pair : namedParams) {
            // We marked all the args that we used, so anything left over is a param assignment
            // for a non-existent parameter.
            auto [argSyntax, used] = pair.second;
            if (!used) {
                auto& diag = scope.addDiag(diag::ParameterDoesNotExist, argSyntax->name.location());
                diag << argSyntax->name.valueText();
                diag << definitionName;
            }
        }
    }
}